

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_LOG10_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement
                )

{
  TA_RetCode TVar1;
  int *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int *in_R8;
  int unaff_retaddr;
  double *in_stack_ffffffffffffffd8;
  
  TVar1 = TA_LOG10(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(double *)CONCAT44(in_ESI,in_EDX),
                   in_RCX,in_R8,in_stack_ffffffffffffffd8);
  return TVar1;
}

Assistant:

TA_RetCode TA_LOG10_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_LOG10(
/* Generated */               startIdx,
/* Generated */               endIdx,
/* Generated */               params->in[0].data.inReal, /* inReal */
/* Generated */               outBegIdx, 
/* Generated */               outNBElement, 
/* Generated */               params->out[0].data.outReal /*  outReal */ );
/* Generated */ }